

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
RunScriptCore(char *script,JsSourceContext sourceContext,char *sourceUrl,bool parseOnly,
             JsParseScriptAttributes parseAttributes,bool isSourceModule,JsValueRef *result)

{
  char16_t *pcVar1;
  size_t cb;
  char *local_60;
  undefined1 local_58 [8];
  NarrowToWide url;
  bool isSourceModule_local;
  JsParseScriptAttributes parseAttributes_local;
  bool parseOnly_local;
  char *sourceUrl_local;
  JsSourceContext sourceContext_local;
  char *script_local;
  
  local_60 = sourceUrl;
  url._31_1_ = isSourceModule;
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
  NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>
                       *)local_58,&local_60,0xffffffffffffffff);
  pcVar1 = utf8::NarrowWideConverter::operator_cast_to_char16_t_((NarrowWideConverter *)local_58);
  if (pcVar1 == (char16_t *)0x0) {
    script_local._4_4_ = JsErrorOutOfMemory;
  }
  else {
    cb = strlen(script);
    pcVar1 = utf8::NarrowWideConverter::operator_cast_to_char16_t_((NarrowWideConverter *)local_58);
    script_local._4_4_ =
         RunScriptCore((JsValueRef)0x0,(byte *)script,cb,LoadScriptFlag_Utf8Source,sourceContext,
                       pcVar1,parseOnly,parseAttributes,(bool)(url._31_1_ & 1),result);
  }
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int>::
  ~NarrowWideConverter
            ((NarrowWideConverter<utf8::malloc_allocator,_const_char_*,_char16_t_*,_unsigned_int> *)
             local_58);
  return script_local._4_4_;
}

Assistant:

JsErrorCode RunScriptCore(const char *script, JsSourceContext sourceContext,
    const char *sourceUrl, bool parseOnly, JsParseScriptAttributes parseAttributes,
    bool isSourceModule, JsValueRef *result)
{
    utf8::NarrowToWide url((LPCSTR)sourceUrl);
    if (!url)
    {
        return JsErrorOutOfMemory;
    }

    return RunScriptCore(nullptr, reinterpret_cast<const byte*>(script), strlen(script),
        LoadScriptFlag_Utf8Source, sourceContext, url, parseOnly, parseAttributes,
        isSourceModule, result);
}